

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

void nn_print_option(nn_parse_context *ctx,int opt_index,FILE *stream)

{
  nn_option *pnVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  
  pnVar1 = ctx->options;
  __s = ctx->last_option_usage[opt_index];
  if ((int)*__s == 0x2d) {
    pcVar2 = strchr(__s,0x3d);
    if (pcVar2 == (char *)0x0) {
      sVar4 = strlen(__s);
    }
    else {
      sVar4 = (long)pcVar2 - (long)__s;
    }
    pcVar2 = pnVar1[opt_index].longname;
    sVar3 = strlen(pcVar2);
    if (sVar4 != sVar3 + 2) {
      fprintf((FILE *)stream," %.*s[%s] ",sVar4 & 0xffffffff,__s,pcVar2 + (sVar4 - 2));
      return;
    }
    pcVar2 = " %s ";
  }
  else {
    if (__s != *ctx->argv) {
      fprintf((FILE *)stream," -%c (--%s) ",(ulong)(uint)(int)*__s,pnVar1[opt_index].longname);
      return;
    }
    pcVar2 = " %s (executable) ";
  }
  fprintf((FILE *)stream,pcVar2,__s);
  return;
}

Assistant:

static void nn_print_option (struct nn_parse_context *ctx, int opt_index,
                            FILE *stream)
{
    char *ousage;
    char *oend;
    size_t olen;
    struct nn_option *opt;

    opt = &ctx->options[opt_index];
    ousage = ctx->last_option_usage[opt_index];
    if (*ousage == '-') {  /* Long option */
        oend = strchr (ousage, '=');
        if (!oend) {
            olen = strlen (ousage);
        } else {
            olen = (oend - ousage);
        }
        if (olen != strlen (opt->longname)+2) {
            fprintf (stream, " %.*s[%s] ",
                (int)olen, ousage, opt->longname + (olen-2));
        } else {
            fprintf (stream, " %s ", ousage);
        }
    } else if (ousage == ctx->argv[0]) {  /* Binary name */
        fprintf (stream, " %s (executable) ", ousage);
    } else {  /* Short option */
        fprintf (stream, " -%c (--%s) ",
            *ousage, opt->longname);
    }
}